

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O2

void __thiscall
serialize_tests::Base::
Unserialize<ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>>
          (Base *this,
          ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>,_serialize_tests::BaseFormat>
          *s)

{
  uint8_t uVar1;
  reference pvVar2;
  long in_FS_OFFSET;
  string_view str;
  string hex;
  _Storage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false> local_68;
  char local_50;
  pointer local_48;
  pointer puStack_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (s->m_params->m_base_format == RAW) {
    uVar1 = ser_readdata8<ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>>
                      (s);
    this->m_base_data = uVar1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"aa",(allocator<char> *)&local_68._M_value);
    local_68._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = local_48;
    local_68._M_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_40;
    ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>
    ::operator>>((ParamsStream<ParamsStream<ParamsStream<serialize_tests::UncopyableStream,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>,serialize_tests::BaseFormat>
                  *)s,(Span<char> *)&local_68._M_value);
    str._M_str = (char *)local_48;
    str._M_len = (size_t)puStack_40;
    TryParseHex<unsigned_char>
              ((optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
               &local_68._M_value,str);
    if (local_50 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        std::__throw_bad_optional_access();
      }
      goto LAB_004fe45d;
    }
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&local_68._M_value,0);
    this->m_base_data = *pvVar2;
    std::_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    _M_reset((_Optional_payload_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
             &local_68._M_value);
    std::__cxx11::string::~string((string *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_004fe45d:
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        if (s.template GetParams<BaseFormat>().m_base_format == BaseFormat::RAW) {
            s >> m_base_data;
        } else {
            std::string hex{"aa"};
            s >> Span{hex}.first(hex.size());
            m_base_data = TryParseHex<uint8_t>(hex).value().at(0);
        }
    }